

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangulateProcess.cpp
# Opt level: O0

void __thiscall Assimp::TriangulateProcess::Execute(TriangulateProcess *this,aiScene *pScene)

{
  bool bVar1;
  bool bVar2;
  Logger *pLVar3;
  uint local_20;
  uint a;
  bool bHas;
  aiScene *pScene_local;
  TriangulateProcess *this_local;
  
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"TriangulateProcess begin");
  bVar1 = false;
  for (local_20 = 0; local_20 < pScene->mNumMeshes; local_20 = local_20 + 1) {
    if ((pScene->mMeshes[local_20] != (aiMesh *)0x0) &&
       (bVar2 = TriangulateMesh(this,pScene->mMeshes[local_20]), bVar2)) {
      bVar1 = true;
    }
  }
  if (bVar1) {
    pLVar3 = DefaultLogger::get();
    Logger::info(pLVar3,"TriangulateProcess finished. All polygons have been triangulated.");
  }
  else {
    pLVar3 = DefaultLogger::get();
    Logger::debug(pLVar3,"TriangulateProcess finished. There was nothing to be done.");
  }
  return;
}

Assistant:

void TriangulateProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("TriangulateProcess begin");

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)
    {
        if (pScene->mMeshes[ a ]) {
            if ( TriangulateMesh( pScene->mMeshes[ a ] ) ) {
                bHas = true;
            }
        }
    }
    if ( bHas ) {
        ASSIMP_LOG_INFO( "TriangulateProcess finished. All polygons have been triangulated." );
    } else {
        ASSIMP_LOG_DEBUG( "TriangulateProcess finished. There was nothing to be done." );
    }
}